

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  ConstPool *this_00;
  Gap *pGVar1;
  Zone *pZVar2;
  Error EVar3;
  Node *pNVar4;
  ulong uVar5;
  ConstPool *newNode;
  size_t sVar6;
  long lVar7;
  size_t length;
  ConstPool *data_00;
  ConstPool *this_01;
  Zone *pZVar8;
  ConstPool *pCVar9;
  ConstPool *this_02;
  ConstPool *pCVar10;
  ConstPool *pCVar11;
  long lVar12;
  bool bVar13;
  ConstPool *local_70;
  long local_68;
  
  EVar3 = 3;
  switch(size) {
  case 1:
    bVar13 = false;
    lVar12 = 0;
    goto LAB_0015e828;
  case 2:
    lVar12 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0015e7ea_caseD_3;
  case 4:
    lVar12 = 2;
    break;
  case 8:
    lVar12 = 3;
    break;
  default:
    if (size != 0x20) {
      if (size != 0x10) {
        return 3;
      }
      lVar12 = 4;
      break;
    }
    lVar12 = 5;
    bVar13 = true;
    goto LAB_0015e828;
  }
  bVar13 = false;
LAB_0015e828:
  this_01 = (ConstPool *)(this->_tree + lVar12);
  newNode = (ConstPool *)data;
  this_02 = this_01;
  pNVar4 = Tree::get((Tree *)this_01,data);
  if (pNVar4 == (Node *)0x0) {
    pCVar10 = (ConstPool *)0xffffffffffffffff;
    local_70 = (ConstPool *)dstOffset;
    if (!bVar13) {
      lVar7 = lVar12 + -5;
      do {
        pGVar1 = this->_gaps[lVar12];
        if (pGVar1 != (Gap *)0x0) {
          pCVar10 = (ConstPool *)pGVar1->_offset;
          sVar6 = pGVar1->_length;
          this->_gaps[lVar12] = pGVar1->_next;
          pGVar1->_next = this->_gapPool;
          this->_gapPool = pGVar1;
          if ((ulong)pCVar10 % size != 0) goto LAB_0015eafc;
          sVar6 = sVar6 - size;
          if (sVar6 != 0) {
            newNode = pCVar10;
            this_02 = this;
            ConstPool_addGap(this,(size_t)pCVar10,sVar6);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
    }
    if (pCVar10 == (ConstPool *)0xffffffffffffffff) {
      sVar6 = this->_size;
      length = (-size & (size - 1) + sVar6) - sVar6;
      if (length != 0) {
        ConstPool_addGap(this,sVar6,length);
        this->_size = this->_size + length;
      }
      pCVar10 = (ConstPool *)this->_size;
      this->_size = (size_t)((long)pCVar10->_tree + (size - 8));
    }
    this_02 = (ConstPool *)this->_zone;
    pCVar9 = (ConstPool *)(size + 0x18);
    newNode = (ConstPool *)this_02->_zone;
    pZVar2 = (Zone *)this_02->_tree[0]._root;
    if ((ConstPool *)((long)pZVar2 - (long)newNode) < pCVar9) goto LAB_0015eb06;
    pZVar8 = (Zone *)((long)&newNode->_tree[0]._length + (long)(pCVar9->_tree + -1));
    this_02->_zone = pZVar8;
    pCVar9 = pCVar10;
    pCVar11 = this;
    if (pZVar2 < pZVar8) {
      add();
    }
    while( true ) {
      pCVar10 = pCVar9;
      if (newNode == (ConstPool *)0x0) {
        newNode = (ConstPool *)0x0;
      }
      else {
        newNode->_zone = (Zone *)0x0;
        newNode->_tree[0]._root = (Node *)0x0;
        *(undefined4 *)&newNode->_tree[0]._length = 1;
        *(uint32_t *)((long)&newNode->_tree[0]._length + 4) = (uint32_t)pCVar9;
        memcpy(&newNode->_tree[0]._dataSize,data,size);
      }
      if (newNode == (ConstPool *)0x0) {
        return 1;
      }
      this_02 = this_01;
      Tree::put((Tree *)this_01,(Node *)newNode);
      uVar5 = pCVar11->_alignment;
      if (pCVar11->_alignment <= size) {
        uVar5 = size;
      }
      pCVar11->_alignment = uVar5;
      local_70->_zone = (Zone *)pCVar9;
      if (size < 5) break;
      local_68 = 1;
      lVar7 = lVar12;
      uVar5 = size;
      while (this = pCVar11, lVar12 = lVar7 + -1, size = uVar5, lVar7 != 0) {
        size = uVar5 >> 1;
        local_68 = local_68 * 2;
        if (local_68 != 0) {
          this_00 = (ConstPool *)(pCVar11->_tree + lVar7 + -1);
          local_70 = (ConstPool *)(size + 0x18);
          this_01 = (ConstPool *)((ulong)pCVar9 & 0xffffffff);
          data_00 = (ConstPool *)data;
          lVar12 = local_68;
LAB_0015ea2d:
          newNode = data_00;
          this_02 = this_00;
          pNVar4 = Tree::get((Tree *)this_00,data_00);
          if (pNVar4 != (Node *)0x0) goto LAB_0015eaa5;
          this_02 = (ConstPool *)pCVar11->_zone;
          this = (ConstPool *)this_02->_zone;
          pZVar2 = (Zone *)this_02->_tree[0]._root;
          if ((ConstPool *)((long)pZVar2 - (long)this) < local_70) {
            newNode = (ConstPool *)Zone::_alloc((Zone *)this_02,(size_t)local_70);
LAB_0015ea68:
            if (newNode == (ConstPool *)0x0) {
              newNode = (ConstPool *)0x0;
            }
            else {
              newNode->_zone = (Zone *)0x0;
              newNode->_tree[0]._root = (Node *)0x0;
              *(undefined4 *)&newNode->_tree[0]._length = 0x80000001;
              *(int *)((long)&newNode->_tree[0]._length + 4) = (int)this_01;
              memcpy(&newNode->_tree[0]._dataSize,data_00,size);
            }
            this_02 = this_00;
            Tree::put((Tree *)this_00,(Node *)newNode);
            goto LAB_0015eaa5;
          }
          pZVar8 = (Zone *)((long)&local_70->_tree[0]._length + (long)(this->_tree + -1));
          this_02->_zone = pZVar8;
          newNode = this;
          if (pZVar8 <= pZVar2) goto LAB_0015ea68;
          newNode = local_70;
          add();
LAB_0015eafc:
          add();
          break;
        }
LAB_0015eac5:
        bVar13 = uVar5 < 10;
        lVar7 = lVar7 + -1;
        uVar5 = size;
        if (bVar13) goto LAB_0015e84d;
      }
      add();
      pCVar9 = newNode;
LAB_0015eb06:
      newNode = (ConstPool *)Zone::_alloc((Zone *)this_02,(size_t)pCVar9);
      pCVar9 = pCVar10;
      pCVar11 = this;
    }
  }
  else {
    *dstOffset = (ulong)pNVar4->_offset;
  }
LAB_0015e84d:
  EVar3 = 0;
switchD_0015e7ea_caseD_3:
  return EVar3;
LAB_0015eaa5:
  data_00 = (ConstPool *)((long)data_00->_tree + (size - 8));
  this_01 = (ConstPool *)(ulong)(uint)((int)this_01 + (int)size);
  lVar12 = lVar12 + -1;
  if (lVar12 == 0) goto LAB_0015eac5;
  goto LAB_0015ea2d;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~static_cast<size_t>(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapLength = gap->_length;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Utils::isAligned<size_t>(offset, size));

      gapLength -= size;
      if (gapLength > 0)
        ConstPool_addGap(this, gapOffset, gapLength);
    }

    gapIndex++;
  }

  if (offset == ~static_cast<size_t>(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Utils::alignDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorNoHeapMemory);

  _tree[treeIndex].put(node);
  _alignment = std::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].put(node);
    }
  }

  return kErrorOk;
}